

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

BlockEntry * __thiscall mkvparser::Segment::GetBlock(Segment *this,CuePoint *cp,TrackPosition *tp)

{
  bool bVar1;
  BlockEntry *pBVar2;
  Cluster *pCVar3;
  long lVar4;
  Cluster **ppCVar5;
  _func_int ***ppp_Var6;
  _func_int ***ppp_Var7;
  
  ppCVar5 = this->m_clusters;
  pBVar2 = (BlockEntry *)(ppCVar5 + this->m_clusterCount);
  ppp_Var6 = &pBVar2->_vptr_BlockEntry + this->m_clusterPreloadCount;
  do {
    if (ppp_Var6 <= ppCVar5) {
      pCVar3 = Cluster::Create(this,-1,tp->m_pos);
      if (pCVar3 != (Cluster *)0x0) {
        bVar1 = PreloadCluster(this,pCVar3,(long)ppCVar5 - (long)this->m_clusters >> 3);
        if (bVar1) {
          pBVar2 = Cluster::GetEntry(pCVar3,cp,tp);
          return pBVar2;
        }
        Cluster::~Cluster(pCVar3);
        operator_delete(pCVar3);
      }
      return (BlockEntry *)0x0;
    }
    ppp_Var7 = (_func_int ***)
               ((long)ppCVar5 +
               (((long)ppp_Var6 - (long)ppCVar5 >> 3) - ((long)ppp_Var6 - (long)ppCVar5 >> 0x3f) &
               0xfffffffffffffffeU) * 4);
    pCVar3 = (Cluster *)*ppp_Var7;
    lVar4 = pCVar3->m_element_start - pCVar3->m_pSegment->m_start;
    if (lVar4 < tp->m_pos) {
      ppCVar5 = (Cluster **)(ppp_Var7 + 1);
      bVar1 = true;
      ppp_Var7 = ppp_Var6;
    }
    else {
      bVar1 = true;
      if (lVar4 <= tp->m_pos) {
        pBVar2 = Cluster::GetEntry(pCVar3,cp,tp);
        bVar1 = false;
        ppp_Var7 = ppp_Var6;
      }
    }
    ppp_Var6 = ppp_Var7;
  } while (bVar1);
  return pBVar2;
}

Assistant:

const BlockEntry* Segment::GetBlock(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) {
  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < tp.m_pos)
      i = k + 1;
    else if (pos > tp.m_pos)
      j = k;
    else
      return pCluster->GetEntry(cp, tp);
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, tp.m_pos);  //, -1);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster->GetEntry(cp, tp);
}